

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O0

void __thiscall hwnet::TCPSocket::linklist::pop_front(linklist *this)

{
  sendContext *s_00;
  sendContext *s;
  linklist *this_local;
  
  if (this->head != (sendContext *)0x0) {
    s_00 = this->head;
    this->head = s_00->next;
    if (this->head == (sendContext *)0x0) {
      this->tail = (sendContext *)0x0;
    }
    putSendContext(s_00);
  }
  return;
}

Assistant:

void pop_front() {
			if(this->head != nullptr){
				auto s = this->head;
				this->head = s->next;
				if(nullptr == this->head) {
					this->tail = nullptr;
				}
				putSendContext(s);
			}
		}